

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_queue.cpp
# Opt level: O0

RK_S32 __thiscall MppQueue::pull(MppQueue *this,void *data,RK_S32 size)

{
  RK_S32 RVar1;
  Mutex *mutex;
  undefined1 local_38 [8];
  AutoMutex autoLock;
  RK_S32 size_local;
  void *data_local;
  MppQueue *this_local;
  
  autoLock.mLock._4_4_ = size;
  if (this->mFlushFlag == 0) {
    sem_wait((sem_t *)&this->mQueuePending);
  }
  mutex = MppMutexCond::mutex((MppMutexCond *)this);
  Mutex::Autolock::Autolock((Autolock *)local_38,mutex,1);
  RVar1 = mpp_list::list_size(&this->super_mpp_list);
  if (RVar1 == 0) {
    this_local._4_4_ = -1;
  }
  else {
    this_local._4_4_ = mpp_list::del_at_head(&this->super_mpp_list,data,autoLock.mLock._4_4_);
  }
  Mutex::Autolock::~Autolock((Autolock *)local_38);
  return this_local._4_4_;
}

Assistant:

RK_S32 MppQueue::pull(void *data, RK_S32 size)
{
    if (!mFlushFlag)
        sem_wait(&mQueuePending);
    {
        AutoMutex autoLock(mpp_list::mutex());
        if (!mpp_list::list_size())
            return MPP_NOK;

        return mpp_list::del_at_head(data, size);
    }
    return MPP_ERR_INIT;
}